

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O2

int file_read(int hdl,void *buffer,long nbytes)

{
  int iVar1;
  size_t sVar2;
  
  if ((handleTable[hdl].last_io_op == 2) &&
     (iVar1 = file_seek(hdl,handleTable[hdl].currentpos), iVar1 != 0)) {
    iVar1 = 0x74;
  }
  else {
    sVar2 = fread(buffer,1,nbytes,(FILE *)handleTable[hdl].fileptr);
    if (sVar2 == 1) {
      if (((ulong)*buffer < 0x21) && ((0x100000401U >> ((ulong)*buffer & 0x3f) & 1) != 0)) {
        return 0x6b;
      }
    }
    else if (sVar2 == nbytes) {
      handleTable[hdl].currentpos = handleTable[hdl].currentpos + nbytes;
      handleTable[hdl].last_io_op = 1;
      return 0;
    }
    iVar1 = 0x6c;
  }
  return iVar1;
}

Assistant:

int file_read(int hdl, void *buffer, long nbytes)
/*
  read bytes from the current position in the file
*/
{
    long nread;
    char *cptr;

    if (handleTable[hdl].last_io_op == IO_WRITE)
    {
        if (file_seek(hdl, handleTable[hdl].currentpos))
            return(SEEK_ERROR);
    }
  
    nread = (long) fread(buffer, 1, nbytes, handleTable[hdl].fileptr);

    if (nread == 1)
    {
         cptr = (char *) buffer;

         /* some editors will add a single end-of-file character to a file */
         /* Ignore it if the character is a zero, 10, or 32 */
         if (*cptr == 0 || *cptr == 10 || *cptr == 32)
             return(END_OF_FILE);
         else
             return(READ_ERROR);
    }
    else if (nread != nbytes)
    {
        return(READ_ERROR);
    }

    handleTable[hdl].currentpos += nbytes;
    handleTable[hdl].last_io_op = IO_READ;
    return(0);
}